

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_func_call(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  SymbolKind kind;
  pointer pWVar1;
  undefined8 *puVar2;
  int *piVar3;
  _Base_ptr this_01;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  int iVar10;
  _Uninitialized<int,_true> _Var11;
  ExpressNode *pEVar12;
  ulong uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Base_ptr p_Var15;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr SVar16;
  string strName;
  string name;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  params;
  RightVal rightVal;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rightParams;
  string tmpPtrName;
  undefined1 local_248 [16];
  undefined1 local_238 [64];
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [24];
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  byte local_180;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  _Base_ptr local_140;
  string local_138;
  string local_118;
  string local_f8 [16];
  size_type local_e8 [2];
  string local_d8;
  string local_b8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_78;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_38;
  
  pEVar12 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar12);
  *(ExpressNode **)this = pEVar12;
  local_140 = (_Base_ptr)&this->matched_index;
  local_238._48_8_ = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140,pEVar12);
  local_1f8 = (element_type *)local_1e8;
  local_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e8[0] = 0;
  local_238._32_8_ = (ExpressNode *)0x0;
  local_238._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a8 = (_Base_ptr)0x0;
  local_1c8._16_8_ = (_Base_ptr)0x0;
  p_Stack_1b0 = (_Base_ptr)0x0;
  local_178.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_180 = 0;
  match_one_word(in_RSI,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_248,
             (in_RSI->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + in_RSI->matched_index);
  std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_238) {
    operator_delete((void *)local_248._0_8_,CONCAT71(local_238._1_7_,local_238[0]) + 1);
  }
  iVar10 = std::__cxx11::string::compare((char *)&local_1f8);
  if ((iVar10 == 0) || (iVar10 = std::__cxx11::string::compare((char *)&local_1f8), iVar10 == 0)) {
    _Var11._M_storage =
         word::Word::get_line_num
                   ((in_RSI->word_list->
                    super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                    _M_impl.super__Vector_impl_data._M_start + in_RSI->matched_index);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_180]._M_data)
              ((anon_class_1_0_00000001 *)local_248,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1a0._M_first);
    local_180 = 0;
    local_1a0._M_first._M_storage = (_Uninitialized<int,_true>)_Var11._M_storage;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1a0._M_first);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&local_178,(value_type *)&local_1a0._M_first);
  }
  local_f8._0_8_ = local_e8;
  std::__cxx11::string::_M_construct<char*>
            (local_f8,local_1f8,
             (undefined1 *)((long)&(local_1f0._M_pi)->_vptr__Sp_counted_base + (long)local_1f8));
  symbolTable::SymbolTable::find_least_layer_symbol
            ((SymbolTable *)local_248,(string *)&in_RSI->symbolTable);
  uVar5 = local_248._8_8_;
  local_238._56_8_ = local_248._0_8_;
  local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_248._0_8_ = (ExpressNode *)0x0;
  if ((size_type *)local_f8._0_8_ != local_e8) {
    operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
  }
  match_one_word(in_RSI,LPARENT);
  uVar13 = in_RSI->matched_index + 1;
  pWVar1 = (in_RSI->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_238._16_8_ = uVar5;
  local_238._24_8_ = in_RSI;
  if (((ulong)(((long)(in_RSI->word_list->
                      super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
              -0x5555555555555555) <= uVar13) ||
     (bVar9 = word::Word::match_token(pWVar1 + uVar13,RPARENT), !bVar9)) {
    iVar10 = std::__cxx11::string::compare((char *)&local_1f8);
    if (iVar10 == 0) {
      local_248._0_8_ = local_238;
      local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_238[0] = '\0';
      local_158 = 0;
      local_150 = 0;
      local_160 = &local_150;
      match_one_word((SyntaxAnalyze *)local_238._24_8_,STRCON);
      uVar6 = local_238._24_8_;
      word::Word::get_self_abi_cxx11_
                (&local_b8,
                 ((*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                    (local_238._24_8_ + 0x18))->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start + *(size_t *)(local_238._24_8_ + 8));
      this_00 = (irGenerator *)(uVar6 + 0x80);
      irGenerator::irGenerator::ir_declare_string((string *)(local_1e8 + 0x10),this_00,&local_b8);
      std::__cxx11::string::operator=((string *)local_248,(string *)(local_1e8 + 0x10));
      if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1e8 + 0x20)) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((string *)(local_1e8 + 0x10),this_00,Ptr);
      std::__cxx11::string::operator=((string *)&local_160,(string *)(local_1e8 + 0x10));
      if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1e8 + 0x20)) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._0_8_ + 1);
      }
      local_98._0_8_ = (long)&local_98 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_160,local_160 + local_158)
      ;
      local_78 = 1;
      local_58._0_8_ = (long)&local_58 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,local_248._0_8_,
                 (pointer)((long)(_func_int ***)local_248._8_8_ + local_248._0_8_));
      local_38 = 1;
      irGenerator::irGenerator::ir_ref
                (this_00,(LeftVal *)&local_98._M_first,(LeftVal *)&local_58._M_first,false);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_38]._M_data)
                ((anon_class_1_0_00000001 *)(local_1e8 + 0x10),
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58._M_first);
      local_38 = -1;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_78]._M_data)
                ((anon_class_1_0_00000001 *)(local_1e8 + 0x10),
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98._M_first);
      local_78 = -1;
      pEVar12 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar12);
      local_1d8._0_8_ = pEVar12;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 0x18),pEVar12);
      uVar7 = local_1d8._8_8_;
      local_238._32_8_ = local_1d8._0_8_;
      uVar6 = local_238._40_8_;
      local_1d8._0_8_ = (element_type *)0x0;
      local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_238._40_8_ = uVar7;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
      }
      *(undefined8 *)local_238._32_8_ = 0x600000001;
      std::__cxx11::string::_M_assign((string *)(local_238._32_8_ + 0x10));
      if (local_160 != &local_150) {
        operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
      }
      if ((ExpressNode *)local_248._0_8_ != (ExpressNode *)local_238) {
        operator_delete((void *)local_248._0_8_,CONCAT71(local_238._1_7_,local_238[0]) + 1);
      }
    }
    else {
      gm_exp((SyntaxAnalyze *)local_248);
      uVar6 = local_238._40_8_;
      local_238._40_8_ = local_248._8_8_;
      local_238._32_8_ = local_248._0_8_;
      local_248._0_8_ = (ExpressNode *)0x0;
      local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
    }
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 *)(local_1c8 + 0x10),(value_type *)(local_238 + 0x20));
    while( true ) {
      pWVar1 = ((*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                  (local_238._24_8_ + 0x18))->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(((long)((*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                             (local_238._24_8_ + 0x18))->
                          super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                  -0x5555555555555555) <= *(size_t *)(local_238._24_8_ + 8) + 1) ||
         (bVar9 = word::Word::match_token(pWVar1 + *(size_t *)(local_238._24_8_ + 8) + 1,COMMA),
         !bVar9)) break;
      match_one_word((SyntaxAnalyze *)local_238._24_8_,COMMA);
      gm_exp((SyntaxAnalyze *)local_248);
      uVar6 = local_238._40_8_;
      local_238._40_8_ = local_248._8_8_;
      local_238._32_8_ = local_248._0_8_;
      local_248._0_8_ = (ExpressNode *)0x0;
      local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(local_1c8 + 0x10),(value_type *)(local_238 + 0x20));
    }
  }
  uVar6 = local_238._24_8_;
  match_one_word((SyntaxAnalyze *)local_238._24_8_,RPARENT);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
    }
  }
  iVar10 = *(int *)&((__node_base_ptr)(local_238._56_8_ + 0x30))->_M_nxt;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
  }
  if (iVar10 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              ((string *)local_248,(irGenerator *)(uVar6 + 0x80),Int);
    puVar2 = *(undefined8 **)local_238._48_8_;
    *puVar2 = 1;
    std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
    if ((ExpressNode *)local_248._0_8_ != (ExpressNode *)local_238) {
      operator_delete((void *)local_248._0_8_,CONCAT71(local_238._1_7_,local_238[0]) + 1);
    }
  }
  else {
    puVar2 = *(undefined8 **)local_238._48_8_;
    *puVar2 = 0x100000001;
    std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
  }
  p_Var8 = p_Stack_1b0;
  if ((_Base_ptr)local_1c8._16_8_ != p_Stack_1b0) {
    p_Var15 = (_Base_ptr)local_1c8._16_8_;
    do {
      piVar3 = *(int **)p_Var15;
      this_01 = p_Var15->_M_parent;
      if (this_01 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        }
      }
      if (*piVar3 == 0) {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_180]._M_data)
                  ((anon_class_1_0_00000001 *)local_248,
                   (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a0._M_first);
        local_1a0._M_first._M_storage = (_Uninitialized<int,_true>)piVar3[2];
        local_180 = 0;
        std::get<0ul,int,int,std::__cxx11::string>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a0._M_first);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::operator=
                  ((variant<int,int,std::__cxx11::string> *)&local_1a0._M_first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar3 + 4)
                  );
      }
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&local_178,(value_type *)&local_1a0._M_first);
      if (this_01 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      p_Var15 = (_Base_ptr)&p_Var15->_M_left;
    } while (p_Var15 != p_Var8);
  }
  uVar5 = local_238._16_8_;
  lVar4 = *(long *)(*(long *)local_238._48_8_ + 0x10);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,lVar4,*(long *)(*(long *)local_238._48_8_ + 0x18) + lVar4);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
    }
  }
  kind = *(SymbolKind *)&((__node_base_ptr)(local_238._56_8_ + 0x30))->_M_nxt;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
    }
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,((__node_base_ptr)(local_238._56_8_ + 8))->_M_nxt,
             (long)&((__node_base_ptr)(local_238._56_8_ + 8))->_M_nxt->_M_nxt +
             (long)((__node_base_ptr)(local_238._56_8_ + 0x10))->_M_nxt);
  irGenerator::irGenerator::getFunctionName
            (&local_d8,(irGenerator *)(local_238._24_8_ + 0x80),&local_138);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_70,&local_178);
  irGenerator::irGenerator::ir_function_call
            ((irGenerator *)(local_238._24_8_ + 0x80),&local_118,kind,&local_d8,&local_70,false);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_180]._M_data)
            ((anon_class_1_0_00000001 *)local_248,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1a0._M_first);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_178);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)(local_1c8 + 0x10));
  _Var14._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._40_8_);
    _Var14._M_pi = extraout_RDX_00;
  }
  if (local_1f8 != (element_type *)local_1e8) {
    operator_delete(local_1f8,CONCAT71(local_1e8._1_7_,local_1e8[0]) + 1);
    _Var14._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
    _Var14._M_pi = extraout_RDX_02;
  }
  SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var14._M_pi;
  SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_238._48_8_;
  return (SharedExNdPtr)
         SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_func_call() {
  SharedExNdPtr node(new ExpressNode());
  SharedSyPtr func;
  string name;
  SharedExNdPtr param;
  vector<SharedExNdPtr> params;
  vector<RightVal> rightParams;
  RightVal rightVal;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();
  if (name == "starttime" || name == "stoptime") {
    rightVal.emplace<0>(get_least_matched_word().get_line_num());
    rightParams.push_back(rightVal);
  }

  func = symbolTable.find_least_layer_symbol(name);

  match_one_word(Token::LPARENT);
  if (!try_word(1, Token::RPARENT)) {
    if (name == "putf") {
      string strName;
      string tmpPtrName;

      match_one_word(Token::STRCON);

      strName =
          irGenerator.ir_declare_string(get_least_matched_word().get_self());
      tmpPtrName = irGenerator.getNewTmpValueName(TyKind::Ptr);
      irGenerator.ir_ref(tmpPtrName, strName);

      param = SharedExNdPtr(new ExpressNode());
      param->_type = NodeType::VAR;
      param->_operation = OperationType::PTR;
      param->_name = tmpPtrName;
    } else {
      param = gm_exp();
    }
    params.push_back(param);

    while (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
      param = gm_exp();
      params.push_back(param);
    }
  }
  match_one_word(Token::RPARENT);

  if (std::static_pointer_cast<FunctionSymbol>(func)->getRet() ==
      SymbolKind::INT) {
    string retValue = irGenerator.getNewTmpValueName(TyKind::Int);
    node->_type = NodeType::VAR;
    node->_operation = OperationType::RETURN_FUNC_CALL;
    node->_name = retValue;
  } else {
    node->_type = NodeType::VAR;
    node->_operation = OperationType::VOID_FUNC_CALL;
    node->_name = name;
  }

  for (auto var : params) {
    if (var->_type == NodeType::CNS) {
      rightVal.emplace<0>(var->_value);
    } else {
      rightVal = var->_name;
    }
    rightParams.push_back(rightVal);
  }
  irGenerator.ir_function_call(
      node->_name, std::static_pointer_cast<FunctionSymbol>(func)->getRet(),
      irGenerator.getFunctionName(
          std::static_pointer_cast<FunctionSymbol>(func)->getName()),
      rightParams);

  return node;
}